

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O2

int __thiscall
btGeneric6DofSpring2Constraint::get_limit_motor_info2
          (btGeneric6DofSpring2Constraint *this,btRotationalLimitMotor2 *limot,btTransform *transA,
          btTransform *transB,btVector3 *linVelA,btVector3 *linVelB,btVector3 *angVelA,
          btVector3 *angVelB,btConstraintInfo2 *info,int row,btVector3 *ax1,int rotational,
          int rotAllowed)

{
  btScalar *pbVar1;
  btVector3 *this_00;
  int iVar2;
  byte bVar3;
  btRotationalLimitMotor2 *pbVar4;
  btVector3 *this_01;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  uint uVar9;
  btScalar bVar10;
  btScalar bVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  uVar7 = (long)info->rowskip * (long)row;
  iVar6 = (int)uVar7;
  uVar5 = (ulong)iVar6;
  pbVar4 = limot;
  if (limot->m_currentLimit == 3) {
    calculateJacobi(this,limot,transA,transB,info,iVar6,ax1,rotational,rotAllowed);
    info->m_constraintError[uVar5] =
         (float)(int)(-(uint)(rotational != 0) | 1) *
         info->fps * limot->m_stopERP * limot->m_currentLimitError;
    info->m_lowerLimit[uVar5] = -3.4028235e+38;
    info->m_upperLimit[uVar5] = 3.4028235e+38;
    iVar2 = 1;
  }
  else {
    iVar2 = 0;
    if (limot->m_currentLimit != 4) goto LAB_00172e21;
    this_01 = angVelB;
    this_00 = angVelA;
    if (rotational == 0) {
      this_01 = linVelB;
      this_00 = linVelA;
    }
    bVar10 = btVector3::dot(this_00,ax1);
    pbVar4 = (btRotationalLimitMotor2 *)ax1;
    bVar11 = btVector3::dot(this_01,ax1);
    calculateJacobi(this,pbVar4,transA,transB,info,iVar6,ax1,rotational,rotAllowed);
    fVar18 = *(float *)(&DAT_001b2860 + (ulong)(rotational == 0) * 4);
    fVar16 = bVar10 - bVar11;
    fVar15 = info->fps * limot->m_stopERP * limot->m_currentLimitError * fVar18;
    pbVar1 = info->m_constraintError;
    pbVar1[uVar7] = fVar15;
    fVar17 = fVar15 - limot->m_stopERP * fVar16;
    if (rotational == 0) {
      bVar10 = 0.0;
      if (fVar17 < 0.0) {
        fVar17 = -limot->m_bounce * fVar16;
        bVar11 = -3.4028235e+38;
        bVar8 = fVar15 < fVar17;
        goto LAB_00172cc2;
      }
      bVar11 = -3.4028235e+38;
    }
    else {
      bVar11 = 0.0;
      if (0.0 < fVar17) {
        fVar17 = -limot->m_bounce * fVar16;
        bVar10 = 3.4028235e+38;
        bVar8 = fVar17 < fVar15;
LAB_00172cc2:
        if (!bVar8 && fVar17 != fVar15) {
          pbVar1[uVar7] = fVar17;
        }
      }
      else {
        bVar10 = 3.4028235e+38;
      }
    }
    info->m_lowerLimit[uVar7] = bVar11;
    info->m_upperLimit[uVar7] = bVar10;
    info->cfm[uVar7] = limot->m_stopCFM;
    uVar5 = (long)info->rowskip + uVar5;
    calculateJacobi(this,pbVar4,transA,transB,info,(int)uVar5,ax1,rotational,rotAllowed);
    fVar18 = fVar18 * info->fps * limot->m_stopERP * limot->m_currentLimitErrorHi;
    pbVar1 = info->m_constraintError;
    pbVar1[uVar5] = fVar18;
    fVar15 = fVar18 - limot->m_stopERP * fVar16;
    if (rotational == 0) {
      bVar10 = 0.0;
      if (fVar15 <= 0.0) {
        bVar11 = 3.4028235e+38;
      }
      else {
        fVar16 = fVar16 * -limot->m_bounce;
        bVar11 = 3.4028235e+38;
        if (fVar18 < fVar16) goto LAB_00172dd7;
      }
    }
    else {
      bVar11 = 0.0;
      if (0.0 <= fVar15) {
        bVar10 = -3.4028235e+38;
      }
      else {
        fVar16 = fVar16 * -limot->m_bounce;
        bVar10 = -3.4028235e+38;
        bVar11 = 0.0;
        if (fVar16 < fVar18) {
LAB_00172dd7:
          pbVar1[uVar5] = fVar16;
        }
      }
    }
    info->m_lowerLimit[uVar5] = bVar10;
    info->m_upperLimit[uVar5] = bVar11;
    iVar2 = 2;
    uVar7 = uVar5 & 0xffffffff;
  }
  info->cfm[uVar5] = limot->m_stopCFM;
  uVar7 = (ulong)(uint)((int)uVar7 + info->rowskip);
LAB_00172e21:
  iVar6 = (int)uVar7;
  bVar3 = limot->m_enableMotor;
  if (((bool)bVar3 == true) && (limot->m_servoMotor == false)) {
    calculateJacobi(this,pbVar4,transA,transB,info,iVar6,ax1,rotational,rotAllowed);
    bVar10 = limot->m_targetVelocity;
    if (rotational == 0) {
      bVar10 = -bVar10;
    }
    bVar10 = btTypedConstraint::getMotorFactor
                       (&this->super_btTypedConstraint,limot->m_currentPosition,limot->m_loLimit,
                        limot->m_hiLimit,bVar10,info->fps * limot->m_motorERP);
    info->m_constraintError[iVar6] = bVar10 * limot->m_targetVelocity;
    info->m_lowerLimit[iVar6] = -limot->m_maxMotorForce;
    info->m_upperLimit[iVar6] = limot->m_maxMotorForce;
    info->cfm[iVar6] = limot->m_motorCFM;
    iVar6 = iVar6 + info->rowskip;
    iVar2 = iVar2 + 1;
    bVar3 = limot->m_enableMotor;
  }
  if (((bVar3 & 1) != 0) && (limot->m_servoMotor == true)) {
    fVar15 = limot->m_currentPosition - limot->m_servoTarget;
    calculateJacobi(this,pbVar4,transA,transB,info,iVar6,ax1,rotational,rotAllowed);
    fVar17 = 0.0;
    fVar18 = (float)(~-(uint)(fVar15 < 0.0) & (uint)limot->m_targetVelocity |
                    (uint)-limot->m_targetVelocity & -(uint)(fVar15 < 0.0));
    if ((fVar15 != 0.0) || (NAN(fVar15))) {
      fVar17 = limot->m_loLimit;
      fVar16 = limot->m_hiLimit;
      if (fVar17 <= fVar16) {
        if ((fVar15 <= 0.0) || (fVar12 = limot->m_servoTarget, limot->m_servoTarget <= fVar17)) {
          fVar12 = fVar17;
        }
        if ((fVar15 < 0.0) && (limot->m_servoTarget < fVar16)) {
          fVar16 = limot->m_servoTarget;
        }
      }
      else {
        if (fVar15 <= 0.0) {
          fVar12 = -3.4028235e+38;
        }
        else {
          fVar12 = limot->m_servoTarget;
        }
        if (0.0 <= fVar15) {
          fVar16 = 3.4028235e+38;
        }
        else {
          fVar16 = limot->m_servoTarget;
        }
      }
      fVar17 = btTypedConstraint::getMotorFactor
                         (&this->super_btTypedConstraint,limot->m_currentPosition,fVar12,fVar16,
                          -fVar18,info->fps * limot->m_motorERP);
    }
    info->m_constraintError[iVar6] = (float)(int)(-(uint)(rotational != 0) | 1) * fVar18 * fVar17;
    info->m_lowerLimit[iVar6] = -limot->m_maxMotorForce;
    info->m_upperLimit[iVar6] = limot->m_maxMotorForce;
    info->cfm[iVar6] = limot->m_motorCFM;
    iVar6 = iVar6 + info->rowskip;
    iVar2 = iVar2 + 1;
  }
  if (limot->m_enableSpring == true) {
    fVar18 = limot->m_currentPosition;
    fVar15 = limot->m_equilibriumPoint;
    calculateJacobi(this,pbVar4,transA,transB,info,iVar6,ax1,rotational,rotAllowed);
    fVar12 = 1.0 / info->fps;
    fVar17 = limot->m_springStiffness;
    fVar16 = limot->m_springDamping;
    if (rotational == 0) {
      angVelB = linVelB;
      angVelA = linVelA;
    }
    bVar10 = btVector3::dot(angVelA,ax1);
    bVar11 = btVector3::dot(angVelB,ax1);
    auVar14._4_4_ = ((this->super_btTypedConstraint).m_rbB)->m_inverseMass;
    auVar14._0_4_ = ((this->super_btTypedConstraint).m_rbA)->m_inverseMass;
    auVar14._8_8_ = 0;
    auVar14 = divps(_DAT_001af400,auVar14);
    fVar19 = auVar14._4_4_;
    if (auVar14._0_4_ <= auVar14._4_4_) {
      fVar19 = auVar14._0_4_;
    }
    fVar13 = fVar17 / fVar19;
    if (fVar13 < 0.0) {
      fVar13 = sqrtf(fVar13);
    }
    else {
      fVar13 = SQRT(fVar13);
    }
    if (limot->m_springStiffnessLimited != false) {
      uVar9 = -(uint)(0.25 < fVar13 * fVar12);
      fVar17 = (float)(~uVar9 & (uint)fVar17 |
                      (uint)(((1.0 / fVar12) / fVar12) * 0.0625 * fVar19) & uVar9);
    }
    if (limot->m_springDampingLimited != false) {
      uVar9 = -(uint)(fVar19 < fVar16 * fVar12);
      fVar16 = (float)(~uVar9 & (uint)fVar16 | (uint)(fVar19 / fVar12) & uVar9);
    }
    fVar16 = -fVar16 * (bVar10 - bVar11) * *(float *)(&DAT_001b2860 + (ulong)(rotational == 0) * 4)
             * fVar12;
    fVar18 = (fVar18 - fVar15) * fVar17 * fVar12 + fVar16;
    info->m_constraintError[iVar6] =
         *(float *)(&DAT_001b2860 + (ulong)(rotational == 0) * 4) * fVar18 + (bVar10 - bVar11);
    fVar15 = fVar16;
    if (fVar16 <= fVar18) {
      fVar15 = fVar18;
      fVar18 = fVar16;
    }
    if (rotational == 0) {
      fVar17 = 0.0;
      if (fVar18 <= 0.0) {
        fVar17 = fVar18;
      }
      info->m_lowerLimit[iVar6] = fVar17;
    }
    else {
      fVar17 = 0.0;
      if (-fVar15 <= 0.0) {
        fVar17 = -fVar15;
      }
      info->m_lowerLimit[iVar6] = fVar17;
      fVar15 = -fVar18;
    }
    fVar18 = 0.0;
    if (0.0 <= fVar15) {
      fVar18 = fVar15;
    }
    info->m_upperLimit[iVar6] = fVar18;
    info->cfm[iVar6] = 0.0;
    iVar2 = iVar2 + 1;
  }
  return iVar2;
}

Assistant:

int btGeneric6DofSpring2Constraint::get_limit_motor_info2(
	btRotationalLimitMotor2 * limot,
	const btTransform& transA,const btTransform& transB,const btVector3& linVelA,const btVector3& linVelB,const btVector3& angVelA,const btVector3& angVelB,
	btConstraintInfo2 *info, int row, btVector3& ax1, int rotational,int rotAllowed)
{
	int count = 0;
	int srow = row * info->rowskip;

	if (limot->m_currentLimit==4) 
	{
		btScalar vel = rotational ? angVelA.dot(ax1) - angVelB.dot(ax1) : linVelA.dot(ax1) - linVelB.dot(ax1);

		calculateJacobi(limot,transA,transB,info,srow,ax1,rotational,rotAllowed);
		info->m_constraintError[srow] = info->fps * limot->m_stopERP * limot->m_currentLimitError * (rotational ? -1 : 1);
		if (rotational) {
			if (info->m_constraintError[srow]-vel*limot->m_stopERP > 0) {
				btScalar bounceerror = -limot->m_bounce* vel;
				if (bounceerror > info->m_constraintError[srow]) info->m_constraintError[srow] = bounceerror;
			}
		} else {
			if (info->m_constraintError[srow]-vel*limot->m_stopERP < 0) {
				btScalar bounceerror = -limot->m_bounce* vel;
				if (bounceerror < info->m_constraintError[srow]) info->m_constraintError[srow] = bounceerror;
			}
		}
		info->m_lowerLimit[srow] = rotational ? 0 : -SIMD_INFINITY;
		info->m_upperLimit[srow] = rotational ? SIMD_INFINITY : 0;
		info->cfm[srow] = limot->m_stopCFM;
		srow += info->rowskip;
		++count;

		calculateJacobi(limot,transA,transB,info,srow,ax1,rotational,rotAllowed);
		info->m_constraintError[srow] = info->fps * limot->m_stopERP * limot->m_currentLimitErrorHi * (rotational ? -1 : 1);
		if (rotational) {
			if (info->m_constraintError[srow]-vel*limot->m_stopERP < 0) {
				btScalar bounceerror = -limot->m_bounce* vel;
				if (bounceerror < info->m_constraintError[srow]) info->m_constraintError[srow] = bounceerror;
			}
		} else {
			if (info->m_constraintError[srow]-vel*limot->m_stopERP > 0) {
				btScalar bounceerror = -limot->m_bounce* vel;
				if (bounceerror > info->m_constraintError[srow]) info->m_constraintError[srow] = bounceerror;
			}
		}
		info->m_lowerLimit[srow] = rotational ? -SIMD_INFINITY : 0;
		info->m_upperLimit[srow] = rotational ? 0 : SIMD_INFINITY;
		info->cfm[srow] = limot->m_stopCFM;
		srow += info->rowskip;
		++count;
	} else
	if (limot->m_currentLimit==3) 
	{
		calculateJacobi(limot,transA,transB,info,srow,ax1,rotational,rotAllowed);
		info->m_constraintError[srow] = info->fps * limot->m_stopERP * limot->m_currentLimitError * (rotational ? -1 : 1);
		info->m_lowerLimit[srow] = -SIMD_INFINITY;
		info->m_upperLimit[srow] = SIMD_INFINITY;
		info->cfm[srow] = limot->m_stopCFM;
		srow += info->rowskip;
		++count;
	}

	if (limot->m_enableMotor && !limot->m_servoMotor)
	{
		calculateJacobi(limot,transA,transB,info,srow,ax1,rotational,rotAllowed);
		btScalar tag_vel = rotational ? limot->m_targetVelocity : -limot->m_targetVelocity;
		btScalar mot_fact = getMotorFactor(limot->m_currentPosition, 
			limot->m_loLimit,
			limot->m_hiLimit,
			tag_vel,
			info->fps * limot->m_motorERP);
		info->m_constraintError[srow] = mot_fact * limot->m_targetVelocity;
		info->m_lowerLimit[srow] = -limot->m_maxMotorForce;
		info->m_upperLimit[srow] = limot->m_maxMotorForce;
		info->cfm[srow] = limot->m_motorCFM;
		srow += info->rowskip;
		++count;
	}

	if (limot->m_enableMotor && limot->m_servoMotor)
	{
		btScalar error = limot->m_currentPosition - limot->m_servoTarget;
		calculateJacobi(limot,transA,transB,info,srow,ax1,rotational,rotAllowed);
		btScalar targetvelocity = error<0 ? -limot->m_targetVelocity : limot->m_targetVelocity;
		btScalar tag_vel = -targetvelocity;
		btScalar mot_fact;
		if(error != 0)
		{
			btScalar lowLimit;
			btScalar hiLimit;
			if(limot->m_loLimit > limot->m_hiLimit)
			{
				lowLimit = error > 0 ? limot->m_servoTarget : -SIMD_INFINITY;
				hiLimit  = error < 0 ? limot->m_servoTarget :  SIMD_INFINITY;
			}
			else
			{
				lowLimit = error > 0 && limot->m_servoTarget>limot->m_loLimit ? limot->m_servoTarget : limot->m_loLimit;
				hiLimit  = error < 0 && limot->m_servoTarget<limot->m_hiLimit ? limot->m_servoTarget : limot->m_hiLimit;
			}
			mot_fact = getMotorFactor(limot->m_currentPosition, lowLimit, hiLimit, tag_vel, info->fps * limot->m_motorERP);
		} 
		else 
		{
			mot_fact = 0;
		}
		info->m_constraintError[srow] = mot_fact * targetvelocity * (rotational ? -1 : 1);
		info->m_lowerLimit[srow] = -limot->m_maxMotorForce;
		info->m_upperLimit[srow] = limot->m_maxMotorForce;
		info->cfm[srow] = limot->m_motorCFM;
		srow += info->rowskip;
		++count;
	}

	if (limot->m_enableSpring)
	{
		btScalar error = limot->m_currentPosition - limot->m_equilibriumPoint;
		calculateJacobi(limot,transA,transB,info,srow,ax1,rotational,rotAllowed);

		//btScalar cfm = 1.0 / ((1.0/info->fps)*limot->m_springStiffness+ limot->m_springDamping);
		//if(cfm > 0.99999)
		//	cfm = 0.99999;
		//btScalar erp = (1.0/info->fps)*limot->m_springStiffness / ((1.0/info->fps)*limot->m_springStiffness + limot->m_springDamping);
		//info->m_constraintError[srow] = info->fps * erp * error * (rotational ? -1.0 : 1.0);
		//info->m_lowerLimit[srow] = -SIMD_INFINITY;
		//info->m_upperLimit[srow] = SIMD_INFINITY;

		btScalar dt = BT_ONE / info->fps;
		btScalar kd = limot->m_springDamping;
		btScalar ks = limot->m_springStiffness;
		btScalar vel = rotational ? angVelA.dot(ax1) - angVelB.dot(ax1) : linVelA.dot(ax1) - linVelB.dot(ax1);
//		btScalar erp = 0.1;
		btScalar cfm = BT_ZERO;
		btScalar mA = BT_ONE / m_rbA.getInvMass();
		btScalar mB = BT_ONE / m_rbB.getInvMass();
		btScalar m = mA > mB ? mB : mA;
		btScalar angularfreq = sqrt(ks / m);


		//limit stiffness (the spring should not be sampled faster that the quarter of its angular frequency)
		if(limot->m_springStiffnessLimited && 0.25 < angularfreq * dt)
		{
			ks = BT_ONE / dt / dt / btScalar(16.0) * m;
		}
		//avoid damping that would blow up the spring
		if(limot->m_springDampingLimited && kd * dt > m)
		{
			kd = m / dt;
		}
		btScalar fs = ks * error * dt;
		btScalar fd = -kd * (vel) * (rotational ? -1 : 1) * dt;
		btScalar f = (fs+fd);

		info->m_constraintError[srow] = (vel + f * (rotational ? -1 : 1)) ;

		btScalar minf = f < fd ? f : fd;
		btScalar maxf = f < fd ? fd : f;
		if(!rotational)
		{
			info->m_lowerLimit[srow] = minf > 0 ? 0 : minf;
			info->m_upperLimit[srow] = maxf < 0 ? 0 : maxf;
		}
		else
		{
			info->m_lowerLimit[srow] = -maxf > 0 ? 0 : -maxf;
			info->m_upperLimit[srow] = -minf < 0 ? 0 : -minf;
		}

		info->cfm[srow] = cfm;
		srow += info->rowskip;
		++count;
	}

	return count;
}